

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::GridDataType0::Encode(GridDataType0 *this,KDataStream *stream)

{
  KUOCTET *pKVar1;
  KUOCTET *pKVar2;
  
  GridData::Encode(&this->super_GridData,stream);
  KDataStream::Write<unsigned_short>(stream,*(unsigned_short *)&(this->super_GridData).field_0xc);
  pKVar1 = (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pKVar2 = (this->m_vui8DataVals).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start; pKVar2 != pKVar1; pKVar2 = pKVar2 + 1) {
    KDataStream::Write(stream,*pKVar2);
  }
  if (((this->super_GridData).field_0xc & 1) == 0) {
    return;
  }
  KDataStream::Write(stream,this->m_ui8Padding);
  return;
}

Assistant:

void GridDataType0::Encode( KDataStream & stream ) const
{
    GridData::Encode( stream );

    stream << m_ui16NumBytes;

    vector<KUINT8>::const_iterator citr = m_vui8DataVals.begin();
    vector<KUINT8>::const_iterator citrEnd = m_vui8DataVals.end();
    for( ; citr != citrEnd; ++citr )
    {
        stream << *citr;
    }

    // Should we add some padding onto the end? We need to have a 16 bit alignment.
    if( m_ui16NumBytes % 2 == 1 )
    {
        stream << m_ui8Padding;
    }
}